

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.h
# Opt level: O1

void __thiscall caldate_t::julian_date(caldate_t *this,int *jy,int *jm,int *jd)

{
  int32_t iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  iVar1 = dayno(this);
  dVar4 = floor((double)iVar1 + 1721119.5 + 0.5);
  dVar5 = floor(((double)((int)dVar4 + 0x5f4) + -122.1) / 365.25);
  dVar6 = floor((double)(int)dVar5 * 365.25);
  iVar3 = ((int)dVar4 + 0x5f4) - (int)dVar6;
  dVar4 = floor((double)iVar3 / 30.6001);
  iVar2 = (-(uint)((int)dVar4 < 0xe) | 0xfffffff3) + (int)dVar4;
  *jm = iVar2;
  *jy = (2 < iVar2 ^ 0xffffed95) + (int)dVar5;
  dVar4 = floor((double)(int)dVar4 * 30.6001);
  *jd = iVar3 - (int)dVar4;
  return;
}

Assistant:

void julian_date(int &jy, int &jm, int &jd)
    {
        int32_t z = (int32_t)floor(julian_dayno() + 0.5);

        int32_t a = z;
        int32_t b = a + 1524;
        int32_t c = (int32_t)floor((b - 122.1) / 365.25);
        int32_t d = (int32_t)floor(365.25 * c);
        int32_t e = (int32_t)floor((b - d) / 30.6001);

        jm = e < 14 ? e - 1 : e - 13;
        jy = jm > 2 ? c - 4716 : c - 4715;
        jd = b - d - (int32_t)floor(30.6001 * e);
    }